

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

bool upb_Message_SetExtensionString
               (upb_Message *msg,upb_MiniTableExtension *e,upb_StringView value,upb_Arena *a)

{
  upb_CType uVar1;
  
  uVar1 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only);
  if ((uVar1 != kUpb_CType_String) &&
     (uVar1 = upb_MiniTableField_CType(&e->field_dont_copy_me__upb_internal_use_only),
     uVar1 != kUpb_CType_Bytes)) {
    __assert_fail("upb_MiniTableExtension_CType(e) == kUpb_CType_String || upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x2e5,
                  "bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
                 );
  }
  __assert_fail("_upb_MiniTableExtension_GetRep_dont_copy_me__upb_internal_use_only(e) == kUpb_FieldRep_StringView"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x2e7,
                "bool upb_Message_SetExtensionString(struct upb_Message *, const upb_MiniTableExtension *, upb_StringView, upb_Arena *)"
               );
}

Assistant:

UPB_API_INLINE bool upb_Message_SetExtensionString(
    struct upb_Message* msg, const upb_MiniTableExtension* e,
    upb_StringView value, upb_Arena* a) {
  UPB_ASSUME(upb_MiniTableExtension_CType(e) == kUpb_CType_String ||
             upb_MiniTableExtension_CType(e) == kUpb_CType_Bytes);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableExtension_GetRep)(e) ==
             kUpb_FieldRep_StringView);
  return upb_Message_SetExtension(msg, e, &value, a);
}